

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O0

TypeSystem * __thiscall
stackjit::TypeSystem::toString_abi_cxx11_(TypeSystem *this,PrimitiveTypes primitiveType)

{
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [19];
  allocator local_12;
  PrimitiveTypes local_11;
  TypeSystem *pTStack_10;
  PrimitiveTypes primitiveType_local;
  
  local_11 = primitiveType;
  pTStack_10 = this;
  switch(primitiveType) {
  case Void:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"Void",&local_12);
    std::allocator<char>::~allocator((allocator<char> *)&local_12);
    break;
  case Integer:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"Int",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case Float:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"Float",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case Bool:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"Bool",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case Char:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"Char",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  return this;
}

Assistant:

std::string TypeSystem::toString(PrimitiveTypes primitiveType) {
		switch (primitiveType) {
			case PrimitiveTypes::Void:
				return "Void";
			case PrimitiveTypes::Integer:
				return "Int";
			case PrimitiveTypes::Float:
				return "Float";
			case PrimitiveTypes::Bool:
				return "Bool";
			case PrimitiveTypes::Char:
				return "Char";
		}

		return "";
	}